

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

CppDirective cpp_directive(Env *env)

{
  State *pSVar1;
  _Bool _Var2;
  TSLexer *pTVar3;
  uint uVar4;
  uint32_t rel;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  pSVar1 = env->state;
  uVar4 = (pSVar1->lookahead).offset;
  if (uVar4 < (pSVar1->lookahead).size) {
    pTVar3 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
  }
  else {
    advance_before(env,0);
    pTVar3 = env->lexer;
  }
  if (pTVar3->lookahead == 0x23) {
    rel = 0;
    do {
      rel = rel + 1;
      pSVar1 = env->state;
      uVar4 = (pSVar1->lookahead).offset + rel;
      if (uVar4 < (pSVar1->lookahead).size) {
        pTVar3 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
      }
      else {
        advance_before(env,rel);
        pTVar3 = env->lexer;
      }
      uVar4 = pTVar3->lookahead;
      if (uVar4 - 0x3001 < 0xffffd01f) {
        bVar7 = false;
      }
      else {
        bVar7 = ("\x01"[uVar4 - 0x20 >> 3] >> (uVar4 & 7) & 1) != 0;
      }
    } while (bVar7);
    _Var2 = token_from(env,"if",rel);
    if (_Var2) {
      return CppStart;
    }
    uVar6 = 0;
    do {
      uVar5 = uVar6;
      if (uVar5 == 2) {
        uVar5 = 2;
        break;
      }
      _Var2 = token_from(env,cpp_tokens_start[uVar5 + 1],rel);
      uVar6 = uVar5 + 1;
    } while (!_Var2);
    if (uVar5 < 2) {
      return CppStart;
    }
    _Var2 = token_from(env,"else",rel);
    if (_Var2) {
      return CppElse;
    }
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 2) {
        uVar6 = 3;
        break;
      }
      _Var2 = token_from(env,cpp_tokens_else[uVar6 + 2],rel);
      uVar6 = uVar6 + 1;
    } while (!_Var2);
    if (uVar6 < 3) {
      return CppElse;
    }
    _Var2 = token_from(env,"endif",rel);
    if (_Var2) {
      return CppEnd;
    }
    _Var2 = token_from(env,"define",rel);
    if (_Var2) {
      return CppOther;
    }
    uVar6 = 0xffffffffffffffff;
    do {
      if (uVar6 == 5) {
        uVar6 = 6;
        break;
      }
      _Var2 = token_from(env,cpp_tokens_other[uVar6 + 2],rel);
      uVar6 = uVar6 + 1;
    } while (!_Var2);
    if (uVar6 < 6) {
      return CppOther;
    }
    pSVar1 = env->state;
    uVar4 = (pSVar1->lookahead).offset + rel;
    if (uVar4 < (pSVar1->lookahead).size) {
      pTVar3 = (TSLexer *)((pSVar1->lookahead).contents + uVar4);
    }
    else {
      advance_before(env,rel);
      pTVar3 = env->lexer;
    }
    if (((uint)pTVar3->lookahead < 0xe) && ((0x3400U >> (pTVar3->lookahead & 0x1fU) & 1) != 0)) {
      return CppOther;
    }
    _Var2 = char1(env,0x21);
    if (_Var2) {
      return (uint)((env->state->contexts).size == 0) << 2;
    }
  }
  return CppNothing;
}

Assistant:

static CppDirective cpp_directive(Env *env) {
  if (!char0(env, '#')) return CppNothing;
  uint32_t start = take_space_from(env, 1);
  if (cpp_cond_start(env, start)) return CppStart;
  else if (cpp_cond_else(env, start)) return CppElse;
  else if (cpp_cond_end(env, start)) return CppEnd;
  else if (cpp_directive_other(env, start)) return CppOther;
  else return CppNothing;
}